

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O2

void deqp::gls::ShaderExecUtil::checkExtension(RenderContext *renderCtx,string *extension)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *__rhs;
  NotSupportedError *this;
  int ndx;
  int iVar3;
  int numExts;
  
  iVar2 = (*renderCtx->_vptr_RenderContext[3])();
  numExts = 0;
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x868))(0x821d);
  iVar3 = 0;
  do {
    if (numExts <= iVar3) {
      this = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&numExts,
                     extension," is not supported");
      tcu::NotSupportedError::NotSupportedError(this,(string *)&numExts);
      __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    __rhs = (char *)(**(code **)(CONCAT44(extraout_var,iVar2) + 0xa80))(0x1f03,iVar3);
    bVar1 = std::operator==(extension,__rhs);
    iVar3 = iVar3 + 1;
  } while (!bVar1);
  return;
}

Assistant:

static void checkExtension (const glu::RenderContext& renderCtx, const std::string& extension)
{
	if (!isExtensionSupported(renderCtx, extension))
		throw tcu::NotSupportedError(extension + " is not supported");
}